

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O2

ir_expression * __thiscall
anon_unknown.dwarf_78949::lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length
          (lower_ubo_reference_visitor *this,ir_expression *expr)

{
  ir_node_type iVar1;
  ir_rvalue *piVar2;
  _func_int **pp_Var3;
  glsl_type *this_00;
  bool row_major_00;
  int iVar4;
  undefined4 extraout_var;
  void *mem_ctx;
  _func_int *p_Var5;
  undefined4 extraout_var_00;
  ir_expression *piVar6;
  ir_expression *piVar7;
  ir_constant *piVar8;
  ir_expression *this_01;
  uint uVar9;
  byte bVar10;
  ir_dereference_variable *deref_var;
  bool row_major;
  uint const_offset;
  ir_rvalue *base_offset;
  glsl_type *local_38;
  ir_variable *var;
  
  if (expr->operation == ir_unop_ssbo_unsized_array_length) {
    piVar2 = expr->operands[0];
    iVar1 = (piVar2->super_ir_instruction).ir_type;
    if (((piVar2 != (ir_rvalue *)0x0 && iVar1 < ir_type_variable) &&
        (piVar2->type->field_0x4 == '\x11')) &&
       (iVar1 < ir_type_constant && piVar2->type->length == 0)) {
      iVar4 = (*(piVar2->super_ir_instruction)._vptr_ir_instruction[8])(piVar2);
      var = (ir_variable *)CONCAT44(extraout_var,iVar4);
      if (var != (ir_variable *)0x0) {
        if (((undefined1  [44])var->data & (undefined1  [44])0xf000) != (undefined1  [44])0x2000) {
          return (ir_expression *)0x0;
        }
        if (var->interface_type == (glsl_type *)0x0) {
          return (ir_expression *)0x0;
        }
        mem_ctx = ralloc_parent(piVar2);
        base_offset = (ir_rvalue *)0x0;
        uVar9 = *(uint *)&var->interface_type->field_0x4 >> 0x16 & 3;
        bVar10 = (uVar9 == 3 |
                 (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                 super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x31) & uVar9 != 0
        ;
        iVar1 = (piVar2->super_ir_instruction).ir_type;
        if (iVar1 == ir_type_dereference_record) {
          pp_Var3 = piVar2[1].super_ir_instruction._vptr_ir_instruction;
          if ((pp_Var3 == (_func_int **)0x0) || (2 < *(uint *)(pp_Var3 + 3))) {
            __assert_fail("interface_deref != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x2ca,
                          "unsigned int (anonymous namespace)::lower_ubo_reference_visitor::calculate_unsized_array_stride(ir_dereference *, enum glsl_interface_packing)"
                         );
          }
          p_Var5 = *(_func_int **)
                    (*(long *)(pp_Var3[4] + 0x20) + (ulong)(*(int *)(pp_Var3[4] + 0xc) - 1) * 0x30);
        }
        else {
          if (iVar1 != ir_type_dereference_variable) {
            __assert_fail("!\"Unsupported dereference type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x2dd,
                          "unsigned int (anonymous namespace)::lower_ubo_reference_visitor::calculate_unsized_array_stride(ir_dereference *, enum glsl_interface_packing)"
                         );
          }
          p_Var5 = piVar2[1].super_ir_instruction._vptr_ir_instruction[4];
        }
        this_00 = *(glsl_type **)(p_Var5 + 0x20);
        row_major_00 = lower_buffer_access::lower_buffer_access::is_dereferenced_thing_row_major
                                 (&this->super_lower_buffer_access,piVar2);
        if (bVar10 == 0) {
          uVar9 = glsl_type::std140_size(this_00,row_major_00);
          uVar9 = uVar9 + 0xf & 0xfffffff0;
        }
        else {
          uVar9 = glsl_type::std430_array_stride(this_00,row_major_00);
        }
        *(undefined4 *)
         &(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
          super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x34 = 3;
        this->variable = var;
        setup_for_load_or_store
                  (this,mem_ctx,var,piVar2,&base_offset,&const_offset,&row_major,&local_38,
                   (uint)bVar10 + (uint)bVar10 * 2);
        iVar4 = (*(this->uniform_block->super_ir_instruction)._vptr_ir_instruction[4])
                          (this->uniform_block,mem_ctx,0);
        piVar6 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        ir_expression::ir_expression
                  (piVar6,0x66,&glsl_type::_int_type,(ir_rvalue *)CONCAT44(extraout_var_00,iVar4),
                   (ir_rvalue *)0x0,(ir_rvalue *)0x0,(ir_rvalue *)0x0);
        piVar7 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        piVar2 = base_offset;
        piVar8 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
        ir_constant::ir_constant(piVar8,const_offset,1);
        ir_expression::ir_expression(piVar7,0x6c,piVar2,(ir_rvalue *)piVar8);
        this_01 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        ir_expression::ir_expression(this_01,0x16,(ir_rvalue *)piVar7);
        piVar7 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        ir_expression::ir_expression(piVar7,0x6d,(ir_rvalue *)piVar6,(ir_rvalue *)this_01);
        piVar6 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        piVar8 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
        ir_constant::ir_constant(piVar8,uVar9,1);
        ir_expression::ir_expression(piVar6,0x76,(ir_rvalue *)piVar7,(ir_rvalue *)piVar8);
        piVar7 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        piVar8 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
        ir_constant::ir_constant(piVar8,0,1);
        ir_expression::ir_expression(piVar7,0x8a,(ir_rvalue *)piVar6,(ir_rvalue *)piVar8);
        return piVar7;
      }
    }
  }
  return (ir_expression *)0x0;
}

Assistant:

ir_expression *
lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length(ir_expression *expr)
{
   if (expr->operation !=
       ir_expression_operation(ir_unop_ssbo_unsized_array_length))
      return NULL;

   ir_rvalue *rvalue = expr->operands[0]->as_rvalue();
   if (!rvalue ||
       !rvalue->type->is_array() || !rvalue->type->is_unsized_array())
      return NULL;

   ir_dereference *deref = expr->operands[0]->as_dereference();
   if (!deref)
      return NULL;

   ir_variable *var = expr->operands[0]->variable_referenced();
   if (!var || !var->is_in_shader_storage_block())
      return NULL;
   return process_ssbo_unsized_array_length(&rvalue, deref, var);
}